

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

DISPOSITION_HANDLE disposition_clone(DISPOSITION_HANDLE value)

{
  DISPOSITION_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (DISPOSITION_HANDLE)malloc(8);
  if (__ptr != (DISPOSITION_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (DISPOSITION_HANDLE)0x0;
}

Assistant:

DISPOSITION_HANDLE disposition_clone(DISPOSITION_HANDLE value)
{
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)malloc(sizeof(DISPOSITION_INSTANCE));
    if (disposition_instance != NULL)
    {
        disposition_instance->composite_value = amqpvalue_clone(((DISPOSITION_INSTANCE*)value)->composite_value);
        if (disposition_instance->composite_value == NULL)
        {
            free(disposition_instance);
            disposition_instance = NULL;
        }
    }

    return disposition_instance;
}